

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void __thiscall
DLightTransfer::DLightTransfer(DLightTransfer *this,sector_t *srcSec,int target,bool copyFloor)

{
  short sVar1;
  int iVar2;
  FSectorTagIterator local_44;
  FSectorTagIterator itr_1;
  FSectorTagIterator itr;
  int secnum;
  bool copyFloor_local;
  int target_local;
  sector_t *srcSec_local;
  DLightTransfer *this_local;
  
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_009fb278;
  this->Source = srcSec;
  this->TargetTag = target;
  this->CopyFloor = copyFloor;
  sVar1 = srcSec->lightlevel;
  this->LastLight = sVar1;
  DoTransfer((int)sVar1,target,copyFloor);
  if (copyFloor) {
    FSectorTagIterator::FSectorTagIterator(&itr_1,target);
    while (iVar2 = FSectorTagIterator::Next(&itr_1), -1 < iVar2) {
      sector_t::ChangeFlags((sector_t *)(sectors + iVar2),0,0,1);
    }
  }
  else {
    FSectorTagIterator::FSectorTagIterator(&local_44,target);
    while (iVar2 = FSectorTagIterator::Next(&local_44), -1 < iVar2) {
      sector_t::ChangeFlags((sector_t *)(sectors + iVar2),1,0,1);
    }
  }
  DThinker::ChangeStatNum(&this->super_DThinker,0x27);
  return;
}

Assistant:

DLightTransfer::DLightTransfer (sector_t *srcSec, int target, bool copyFloor)
{
	int secnum;

	Source = srcSec;
	TargetTag = target;
	CopyFloor = copyFloor;
	DoTransfer (LastLight = srcSec->lightlevel, target, copyFloor);

	if (copyFloor)
	{
		FSectorTagIterator itr(target);
		while ((secnum = itr.Next()) >= 0)
			sectors[secnum].ChangeFlags(sector_t::floor, 0, PLANEF_ABSLIGHTING);
	}
	else
	{
		FSectorTagIterator itr(target);
		while ((secnum = itr.Next()) >= 0)
			sectors[secnum].ChangeFlags(sector_t::ceiling, 0, PLANEF_ABSLIGHTING);
	}
	ChangeStatNum (STAT_LIGHTTRANSFER);
}